

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

void Gia_ManMarkTfi_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  while( true ) {
    iVar2 = Gia_ObjIsTravIdCurrent(p,pObj);
    if (iVar2 != 0) {
      return;
    }
    iVar2 = Gia_ObjId(p,pObj);
    if (p->nTravIdsAlloc <= iVar2) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar2 = p->nTravIds;
    piVar1 = p->pTravIds;
    iVar3 = Gia_ObjId(p,pObj);
    piVar1[iVar3] = iVar2;
    if ((int)(uint)*(undefined8 *)pObj < 0) {
      return;
    }
    uVar4 = (uint)*(undefined8 *)pObj & 0x1fffffff;
    if (uVar4 == 0x1fffffff) break;
    Gia_ManMarkTfi_rec(p,pObj + -(ulong)uVar4);
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  return;
}

Assistant:

void Gia_ManMarkTfi_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Gia_ManMarkTfi_rec( p, Gia_ObjFanin0(pObj) );
    Gia_ManMarkTfi_rec( p, Gia_ObjFanin1(pObj) );
}